

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

void readPic<PicHeaderSwitch>(istream *stream,PicHeader *header)

{
  bool bVar1;
  value_type_conflict4 vVar2;
  value_type_conflict3 vVar3;
  int iVar4;
  uint32_t uVar5;
  istream *stream_00;
  reference pPVar6;
  undefined1 *in_RSI;
  long in_RDI;
  PicChunkSwitch c;
  PicChunk *chunk;
  iterator __end1;
  iterator __begin1;
  vector<PicChunk,_std::allocator<PicChunk>_> *__range1;
  PicHeaderSwitch h;
  vector<PicChunk,_std::allocator<PicChunk>_> *in_stack_ffffffffffffff78;
  istream *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  __normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_> local_40;
  undefined1 *local_38;
  undefined1 *local_10;
  long local_8;
  
  *in_RSI = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  readRaw<PicHeaderSwitch>(in_stack_ffffffffffffff80);
  vVar3 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
                    ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                      *)0x117a7c);
  *(value_type_conflict3 *)(local_10 + 4) = vVar3;
  iVar4 = PicHeaderSwitch::getVersion((PicHeaderSwitch *)0x117a90);
  *(int *)(local_10 + 8) = iVar4;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x117aa8);
  *(value_type_conflict4 *)(local_10 + 0xe) = vVar2;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x117ac2);
  *(value_type_conflict4 *)(local_10 + 0xc) = vVar2;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x117adc);
  *(value_type_conflict4 *)(local_10 + 0x10) = vVar2;
  vVar2 = boost::endian::
          endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
          value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                 *)0x117af6);
  *(value_type_conflict4 *)(local_10 + 0x12) = vVar2;
  stream_00 = (istream *)(local_10 + 0x18);
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *)
          0x117b1e);
  std::vector<PicChunk,_std::allocator<PicChunk>_>::resize
            ((vector<PicChunk,_std::allocator<PicChunk>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  PicHeaderSwitch::bytesToSkip((PicHeaderSwitch *)0x117b43);
  std::istream::ignore(local_8);
  local_38 = local_10 + 0x18;
  local_40._M_current =
       (PicChunk *)
       std::vector<PicChunk,_std::allocator<PicChunk>_>::begin(in_stack_ffffffffffffff78);
  std::vector<PicChunk,_std::allocator<PicChunk>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>
                        *)stream_00,
                       (__normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar1) break;
    pPVar6 = __gnu_cxx::
             __normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>::
             operator*(&local_40);
    readRaw<PicChunkSwitch>(stream_00);
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x117bd5);
    pPVar6->x = vVar2;
    vVar2 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x117bee);
    pPVar6->y = vVar2;
    vVar3 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                   *)0x117c08);
    pPVar6->offset = vVar3;
    uVar5 = PicChunkSwitch::getSize((PicChunkSwitch *)0x117c1c);
    pPVar6->size = uVar5;
    __gnu_cxx::__normal_iterator<PicChunk_*,_std::vector<PicChunk,_std::allocator<PicChunk>_>_>::
    operator++(&local_40);
  }
  return;
}

Assistant:

void readPic(std::istream& stream, PicHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	header.filesize = h.filesize.value();
	header.version = h.getVersion();
	header.eh = h.eh.value();
	header.ew = h.ew.value();
	header.width = h.width.value();
	header.height = h.height.value();
	header.chunks.resize(h.chunks.value());

	stream.ignore(h.bytesToSkip());

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		chunk.x = c.x.value();
		chunk.y = c.y.value();
		chunk.offset = c.offset.value();
		chunk.size = c.getSize();
	}
}